

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseData<QList<int>>::resolve<QList<int>&>
          (PromiseData<QList<int>> *this,QList<int> *value)

{
  __shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<QList<int>,QList<int>const&>((QList<int> *)&local_20);
  std::__shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2> *)(this + 0x58),&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::setSettled
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }